

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-info.cpp
# Opt level: O0

void __thiscall MyJXSDescriptor::FillDescriptor(MyJXSDescriptor *this,MXFReader *Reader)

{
  size_t *this_00;
  MXFReader *pMVar1;
  bool bVar2;
  Dictionary *pDVar3;
  byte_t *pbVar4;
  CDCIEssenceDescriptor *pCVar5;
  RGBAEssenceDescriptor *pRVar6;
  unsigned_long_long *puVar7;
  JPEGXSPictureSubDescriptor *pJVar8;
  ILogSink *pIVar9;
  long *plVar10;
  reference ppIVar11;
  Result_t local_108 [104];
  undefined1 local_a0 [8];
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> ObjectList
  ;
  UL local_68;
  UL local_38;
  MXFReader *local_18;
  MXFReader *Reader_local;
  MyJXSDescriptor *this_local;
  
  local_18 = Reader;
  Reader_local = (MXFReader *)this;
  pDVar3 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar4 = ASDCP::Dictionary::ul(pDVar3,MDD_CDCIEssenceDescriptor);
  ASDCP::UL::UL(&local_38,pbVar4);
  pCVar5 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::CDCIEssenceDescriptor>
                     (Reader,&local_38);
  this->m_CDCIDescriptor = pCVar5;
  ASDCP::UL::~UL(&local_38);
  pMVar1 = local_18;
  pDVar3 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar4 = ASDCP::Dictionary::ul(pDVar3,MDD_RGBAEssenceDescriptor);
  ASDCP::UL::UL(&local_68,pbVar4);
  pRVar6 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::RGBAEssenceDescriptor>
                     (pMVar1,&local_68);
  this->m_RGBADescriptor = pRVar6;
  ASDCP::UL::~UL(&local_68);
  if (this->m_RGBADescriptor == (RGBAEssenceDescriptor *)0x0) {
    if (this->m_CDCIDescriptor == (CDCIEssenceDescriptor *)0x0) {
      pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Error(pIVar9,"Picture descriptor not found.\n");
    }
    else {
      ASDCP::MXF::Rational::operator=
                (&this->m_SampleRate,(Rational *)(this->m_CDCIDescriptor + 0xe8));
      bVar2 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                        ((optional_property<unsigned_long_long> *)(this->m_CDCIDescriptor + 0xf8));
      if (!bVar2) {
        puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                           ((optional_property *)(this->m_CDCIDescriptor + 0xf8));
        this->ContainerDuration = *puVar7;
      }
    }
  }
  else {
    ASDCP::MXF::Rational::operator=(&this->m_SampleRate,(Rational *)(this->m_RGBADescriptor + 0xe8))
    ;
    bVar2 = ASDCP::MXF::optional_property<unsigned_long_long>::empty
                      ((optional_property<unsigned_long_long> *)(this->m_RGBADescriptor + 0xf8));
    if (!bVar2) {
      puVar7 = ASDCP::MXF::optional_property::operator_cast_to_unsigned_long_long_
                         ((optional_property *)(this->m_RGBADescriptor + 0xf8));
      this->ContainerDuration = *puVar7;
    }
  }
  pMVar1 = local_18;
  pDVar3 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar4 = ASDCP::Dictionary::ul(pDVar3,MDD_JPEGXSPictureSubDescriptor);
  this_00 = &ObjectList.
             super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
             ._M_impl._M_node._M_size;
  ASDCP::UL::UL((UL *)this_00,pbVar4);
  pJVar8 = get_descriptor_by_type<AS_02::JXS::MXFReader,ASDCP::MXF::JPEGXSPictureSubDescriptor>
                     (pMVar1,(UL *)this_00);
  this->m_JPEGXSSubDescriptor = pJVar8;
  ASDCP::UL::~UL((UL *)&ObjectList.
                        super__List_base<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                        ._M_impl._M_node._M_size);
  if (this->m_JPEGXSSubDescriptor == (JPEGXSPictureSubDescriptor *)0x0) {
    pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar9,"JPEGXSPictureSubDescriptor not found.\n");
  }
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_a0);
  plVar10 = (long *)(**(code **)(*(long *)local_18 + 0x10))();
  pDVar3 = (Dictionary *)ASDCP::DefaultCompositeDict();
  pbVar4 = ASDCP::Dictionary::ul(pDVar3,MDD_Track);
  (**(code **)(*plVar10 + 0xb0))(local_108,plVar10,pbVar4,local_a0);
  Kumu::Result_t::~Result_t(local_108);
  bVar2 = std::__cxx11::
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
          empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                 *)local_a0);
  if (bVar2) {
    pIVar9 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar9,"MXF Metadata contains no Track Sets.\n");
  }
  ppIVar11 = std::__cxx11::
             list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
             ::front((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                      *)local_a0);
  ASDCP::MXF::Rational::operator=(&this->m_EditRate,(Rational *)(*ppIVar11 + 0x100));
  std::__cxx11::
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::~list
            ((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
              *)local_a0);
  return;
}

Assistant:

void FillDescriptor(AS_02::JXS::MXFReader& Reader)
  {
    m_CDCIDescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, CDCIEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_CDCIEssenceDescriptor));

    m_RGBADescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, RGBAEssenceDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_RGBAEssenceDescriptor));

    if ( m_RGBADescriptor != 0 )
      {
    	m_SampleRate = m_RGBADescriptor->SampleRate;
        if ( ! m_RGBADescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_RGBADescriptor->ContainerDuration;
          }
      }
    else if ( m_CDCIDescriptor != 0 )
      {
    	m_SampleRate = m_CDCIDescriptor->SampleRate;
        if ( ! m_CDCIDescriptor->ContainerDuration.empty() )
          {
            ContainerDuration = m_CDCIDescriptor->ContainerDuration;
          }
      }
    else
      {
	DefaultLogSink().Error("Picture descriptor not found.\n");
      }

    m_JPEGXSSubDescriptor = get_descriptor_by_type<AS_02::JXS::MXFReader, JPEGXSPictureSubDescriptor>
      (Reader, DefaultCompositeDict().ul(MDD_JPEGXSPictureSubDescriptor));

    if ( m_JPEGXSSubDescriptor == 0 )
      {
	DefaultLogSink().Error("JPEGXSPictureSubDescriptor not found.\n");
      }

    std::list<InterchangeObject*> ObjectList;
    Reader.OP1aHeader().GetMDObjectsByType(DefaultCompositeDict().ul(MDD_Track), ObjectList);
    
    if ( ObjectList.empty() )
      {
	DefaultLogSink().Error("MXF Metadata contains no Track Sets.\n");
      }

    m_EditRate = ((Track*)ObjectList.front())->EditRate;
  }